

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrsubstructCondense.cpp
# Opt level: O3

TPZVec<int> * __thiscall
TPZDohrSubstructCondense<double>::GatherVec
          (TPZDohrSubstructCondense<double> *this,ENumbering origin,ENumbering destination)

{
  const_iterator cVar1;
  TPZVec<int> *pTVar2;
  key_type local_18;
  
  local_18.second = origin;
  local_18.first = destination;
  cVar1 = std::
          _Rb_tree<std::pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>,_std::pair<const_std::pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>,_TPZVec<int>_>,_std::_Select1st<std::pair<const_std::pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>,_TPZVec<int>_>_>,_std::less<std::pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>_>,_std::allocator<std::pair<const_std::pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>,_TPZVec<int>_>_>_>
          ::find(&(this->fPermutationsScatter)._M_t,&local_18);
  if ((_Rb_tree_header *)cVar1._M_node ==
      &(this->fPermutationsScatter)._M_t._M_impl.super__Rb_tree_header) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Gathervec not found",0x13);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
    std::ostream::put(-0x58);
    std::ostream::flush();
    pTVar2 = &dummyvec;
    TPZVec<int>::Resize(&dummyvec,0);
  }
  else {
    pTVar2 = (TPZVec<int> *)&cVar1._M_node[1]._M_parent;
  }
  return pTVar2;
}

Assistant:

const TPZVec<int> &TPZDohrSubstructCondense<TVar>::GatherVec(ENumbering origin, ENumbering destination) const
{
	typename std::map<std::pair<ENumbering,ENumbering>, TPZVec<int> >::const_iterator it;
	it = fPermutationsScatter.find(std::pair<ENumbering,ENumbering>(destination,origin));
	if(it != fPermutationsScatter.end())
	{
		return it->second;
	}
	else
	{
		LOGPZ_ERROR(logger,"Gathervec not found");
		dummyvec.Resize(0);
		return dummyvec;
	}
}